

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void baryonyx::itm::init_with_random
               (bit_array *x,random_engine *rng,int variables,double init_ramdom)

{
  int i;
  int index;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  double dVar1;
  
  for (index = 0; variables != index; index = index + 1) {
    dVar1 = std::
            generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                      (rng);
    if (init_ramdom <= dVar1) {
      bit_array_impl::unset(&x->super_bit_array_impl,index);
    }
    else {
      bit_array_impl::set(&x->super_bit_array_impl,index);
    }
  }
  return;
}

Assistant:

inline void
init_with_random(bit_array& x,
                 random_engine& rng,
                 const int variables,
                 const double init_ramdom) noexcept
{
    std::bernoulli_distribution dist(init_ramdom);

    for (int i = 0; i != variables; ++i)
        if (dist(rng))
            x.set(i);
        else
            x.unset(i);
}